

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator-debug.c
# Opt level: O0

int emulator_add_breakpoint(Emulator *e,Address addr,Bool enabled)

{
  int id_00;
  int id;
  Bool enabled_local;
  Address addr_local;
  Emulator *e_local;
  
  id_00 = emulator_add_empty_breakpoint();
  if (-1 < id_00) {
    emulator_set_breakpoint_address(e,id_00,addr);
    emulator_enable_breakpoint(id_00,enabled);
  }
  return id_00;
}

Assistant:

int emulator_add_breakpoint(Emulator* e, Address addr, Bool enabled) {
  int id = emulator_add_empty_breakpoint();
  if (id < 0) {
    return id;
  }
  emulator_set_breakpoint_address(e, id, addr);
  emulator_enable_breakpoint(id, enabled);
  return id;
}